

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

Storage3D * allocateStorage(array<long,_3UL> sizes)

{
  value_type vVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  const_reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  double *pdVar11;
  Storage3D *in_RDI;
  Storage3D *result;
  int64_t allocSize;
  
  pvVar8 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)&stack0x00000008,0);
  vVar1 = *pvVar8;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->sizes,2);
  *pvVar9 = vVar1;
  pvVar8 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)&stack0x00000008,1);
  vVar1 = *pvVar8;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->sizes,1);
  *pvVar9 = vVar1;
  pvVar8 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)&stack0x00000008,2);
  vVar1 = *pvVar8;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->sizes,0);
  *pvVar9 = vVar1;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->strides,2);
  *pvVar9 = 1;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->sizes,2);
  vVar1 = *pvVar9;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->strides,1);
  *pvVar9 = vVar1;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->sizes,2);
  lVar2 = *pvVar9;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->sizes,1);
  lVar3 = *pvVar9;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->strides,0);
  *pvVar9 = lVar2 * lVar3;
  iVar5 = halo_width;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->strides,0);
  iVar6 = halo_width;
  lVar2 = *pvVar9;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->strides,1);
  iVar7 = halo_width;
  lVar3 = *pvVar9;
  pvVar9 = std::array<long,_3UL>::operator[](&in_RDI->strides,2);
  in_RDI->offset = iVar5 * lVar2 + iVar6 * lVar3 + iVar7 * *pvVar9;
  pvVar8 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)&stack0x00000008,0);
  lVar2 = *pvVar8;
  pvVar8 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)&stack0x00000008,1);
  lVar3 = *pvVar8;
  pvVar8 = std::array<long,_3UL>::operator[]((array<long,_3UL> *)&stack0x00000008,2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = lVar2 * lVar3 * *pvVar8 + (0x20 - halo_width);
  uVar10 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pdVar11 = (double *)operator_new__(uVar10);
  in_RDI->allocatedPtr = pdVar11;
  in_RDI->alignedPtr = in_RDI->allocatedPtr + (0x20 - halo_width);
  return in_RDI;
}

Assistant:

Storage3D allocateStorage(const std::array<int64_t, 3> sizes) {
  Storage3D result;
  // initialize the size
  result.sizes[2] = sizes[0];
  result.sizes[1] = sizes[1];
  result.sizes[0] = sizes[2];
  // initialize the strides
  result.strides[2] = 1;
  result.strides[1] = result.sizes[2];
  result.strides[0] = result.sizes[2] * result.sizes[1];
  result.offset = halo_width * result.strides[0] +
                  halo_width * result.strides[1] +
                  halo_width * result.strides[2];
  const int64_t allocSize = sizes[0] * sizes[1] * sizes[2];
  result.allocatedPtr = new ElementType[allocSize + (32 - halo_width)];
  result.alignedPtr = &result.allocatedPtr[(32 - halo_width)];
  return result;
}